

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.h
# Opt level: O0

Rectangle * __thiscall
pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
          (World *this,Vector3 *args,Vector3 *args_1,Vector3 *args_2,Vector3 *args_3)

{
  reference this_00;
  Rectangle *pRVar1;
  undefined1 local_40 [8];
  unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> local_38;
  Vector3 *local_30;
  Vector3 *args_local_3;
  Vector3 *args_local_2;
  Vector3 *args_local_1;
  Vector3 *args_local;
  World *this_local;
  
  local_30 = args_3;
  args_local_3 = args_2;
  args_local_2 = args_1;
  args_local_1 = args;
  args_local = (Vector3 *)this;
  std::make_unique<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
            ((Vector3 *)local_40,args,args_1,args_2);
  std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>::
  unique_ptr<pm::Rectangle,std::default_delete<pm::Rectangle>,void>
            ((unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>> *)&local_38,
             (unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_40);
  std::
  vector<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
  ::push_back(&this->objects_,(value_type *)&local_38);
  std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>::~unique_ptr(&local_38);
  std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::~unique_ptr
            ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_40);
  this_00 = std::
            vector<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
            ::back(&this->objects_);
  pRVar1 = (Rectangle *)
           std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>::get(this_00);
  return pRVar1;
}

Assistant:

T *createObject(Args &&... args)
	{
		objects_.push_back(std::make_unique<T>(std::forward<Args>(args)...));
		return static_cast<T *>(objects_.back().get());
	}